

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetValueForTypeOf<false,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext_00;
  undefined4 *puVar4;
  ThreadContext *this;
  PropertyRecord *this_00;
  char16 *varName;
  JavascriptLibrary *this_01;
  Var errorObject_00;
  Var errorObject;
  JavascriptException *err;
  AutoCleanup autoCleanup;
  undefined1 local_b0 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  JavascriptExceptionObject *exceptionObject;
  Var prop;
  Var value;
  PropertyValueInfo info;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  PolymorphicInlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  scriptContext_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1f37,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  BVar3 = GetPropertyObject(instance,scriptContext_00,(RecyclableObject **)&info.inlineCacheIndex);
  if (BVar3 == 0) {
    this = ScriptContext::GetThreadContext(scriptContext_00);
    bVar2 = ThreadContext::RecordImplicitException(this);
    if (bVar2) {
      this_00 = ScriptContext::GetPropertyName(scriptContext_00,propertyId);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec48,varName);
    }
    this_01 = ScriptContext::GetLibrary(scriptContext_00);
    functionBody_local =
         (FunctionBody *)JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,functionBody,inlineCache,inlineCacheIndex,true);
    bVar2 = CacheOperators::TryGetProperty<true,true,true,true,true,true,false,true,false,false>
                      (instance,false,(RecyclableObject *)info._56_8_,propertyId,&prop,
                       scriptContext_00,(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)&value);
    if (bVar2) {
      functionBody_local = (FunctionBody *)prop;
    }
    else {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
      if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchGetValueForTypeOf",propertyId,scriptContext_00,
                   (RecyclableObject *)info._56_8_);
      }
      autoCatchHandlerExists.m_threadContext = (ThreadContext *)0x0;
      JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)local_b0,scriptContext_00,true);
      PatchGetValueForTypeOf<false,Js::PolymorphicInlineCache>(Js::FunctionBody*,Js::
      PolymorphicInlineCache*,unsigned_int,void*,int)::AutoCleanup::AutoCleanup(Js::ScriptContext__
                (&err,scriptContext_00);
      functionBody_local =
           (FunctionBody *)
           GetProperty(instance,(RecyclableObject *)info._56_8_,propertyId,scriptContext_00,
                       (PropertyValueInfo *)&value);
      PatchGetValueForTypeOf<false,_Js::PolymorphicInlineCache>::AutoCleanup::~AutoCleanup
                ((AutoCleanup *)&err);
      JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)local_b0);
      if (autoCatchHandlerExists.m_threadContext != (ThreadContext *)0x0) {
        errorObject_00 =
             JavascriptExceptionObject::GetThrownObject
                       ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                        (ScriptContext *)0x0);
        bVar2 = JavascriptError::ShouldTypeofErrorBeReThrown(errorObject_00);
        if (bVar2) {
          bVar2 = ScriptContext::IsScriptContextInDebugMode(scriptContext_00);
          if (bVar2) {
            JavascriptExceptionOperators::ThrowExceptionObject
                      ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                       scriptContext_00,true,(PVOID)0x0,false);
          }
          JavascriptExceptionOperators::DoThrowCheckClone
                    ((JavascriptExceptionObject *)autoCatchHandlerExists.m_threadContext,
                     scriptContext_00);
        }
      }
      bVar2 = ScriptContext::IsUndeclBlockVar(scriptContext_00,functionBody_local);
      if (bVar2) {
        JavascriptError::ThrowReferenceError(scriptContext_00,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
  }
  return functionBody_local;
}

Assistant:

Var JavascriptOperators::PatchGetValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetValueForTypeOf);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            instance, false, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        Var prop = nullptr;

        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        prop = JavascriptOperators::GetProperty(instance, object, propertyId, scriptContext, &info);
        END_TYPEOF_ERROR_HANDLER(scriptContext, prop);

        return prop;
        JIT_HELPER_END(Op_PatchGetValueForTypeOf);
    }